

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensor.cpp
# Opt level: O1

void __thiscall DIS::Sensor::unmarshal(Sensor *this,DataStream *dataStream)

{
  DataStream::operator>>(dataStream,&this->_sensorTypeSource);
  DataStream::operator>>(dataStream,&this->_sensorOnOffStatus);
  DataStream::operator>>(dataStream,&this->_sensorType);
  DataStream::operator>>(dataStream,&this->_station);
  DataStream::operator>>(dataStream,&this->_quantity);
  DataStream::operator>>(dataStream,&this->_padding);
  return;
}

Assistant:

void Sensor::unmarshal(DataStream& dataStream)
{
    dataStream >> _sensorTypeSource;
    dataStream >> _sensorOnOffStatus;
    dataStream >> _sensorType;
    dataStream >> _station;
    dataStream >> _quantity;
    dataStream >> _padding;
}